

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O0

void __thiscall
PieceSquareTableInterpolating::PieceSquareTableInterpolating
          (PieceSquareTableInterpolating *this,PieceSquareRawTableType *table,
          float fInterpolationFactor)

{
  float fInterpolationFactor_local;
  PieceSquareRawTableType *table_local;
  PieceSquareTableInterpolating *this_local;
  
  PieceSquareTableBase::PieceSquareTableBase(&this->super_PieceSquareTableBase);
  (this->super_PieceSquareTableBase)._vptr_PieceSquareTableBase =
       (_func_int **)&PTR_InvertColor_0014f4b8;
  std::vector<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>::vector
            (&this->m_InterpolatedTables);
  std::vector<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>::vector
            (&this->m_SourceTables);
  std::vector<float,_std::allocator<float>_>::vector(&this->m_Phases);
  this->m_nCurrentTable = 0;
  this->m_fPhase = 0.0;
  Append(this,table,fInterpolationFactor);
  return;
}

Assistant:

PieceSquareTableInterpolating( const PieceSquareRawTableType &table,
                                   const float fInterpolationFactor = 0.0f ) :
        m_nCurrentTable( 0 ),
        m_fPhase( 0.0f )
    {
        Append( table, fInterpolationFactor );
    }